

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexay.cpp
# Opt level: O0

int __thiscall Lexay::getChar(Lexay *this)

{
  bool bVar1;
  istream *piVar2;
  char *pcVar3;
  string local_40 [32];
  long local_20;
  size_t pos;
  Lexay *this_local;
  
  pos = (size_t)this;
  while( true ) {
    if (linepos < linelen) {
      linepos = linepos + 1;
      pcVar3 = (char *)std::__cxx11::string::operator[](0x110900);
      return (int)*pcVar3;
    }
    Basic::linenum = Basic::linenum + 1;
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)Basic::source,(string *)currline_abi_cxx11_,'\n');
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
    if (!bVar1) break;
    linelen = std::__cxx11::string::size();
    linepos = 0;
    local_20 = std::__cxx11::string::find(currline_abi_cxx11_,0x10c544);
    if (local_20 != -1) {
      std::__cxx11::string::substr((ulong)local_40,0x110900);
      std::__cxx11::string::operator=((string *)currline_abi_cxx11_,local_40);
      std::__cxx11::string::~string(local_40);
      linelen = std::__cxx11::string::size();
    }
  }
  lineflag = true;
  return -1;
}

Assistant:

int Lexay::getChar(){
	while(linepos >= linelen){
		linenum++;
		if(std::getline((*source), currline, '\n')){
			linelen = currline.size();
			linepos = 0;
			size_t pos = currline.find("//");
			if(pos != std::string::npos){
				currline = currline.substr(0, pos);
				linelen = currline.size();
			}
		}else{
			lineflag = true;
			return EOF;
		}
	}

	return currline[linepos++];
}